

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * get_array_item(cJSON *array,size_t index)

{
  cJSON *local_28;
  cJSON *current_child;
  size_t index_local;
  cJSON *array_local;
  
  if (array == (cJSON *)0x0) {
    array_local = (cJSON *)0x0;
  }
  else {
    current_child = (cJSON *)index;
    for (local_28 = array->child; local_28 != (cJSON *)0x0 && current_child != (cJSON *)0x0;
        local_28 = local_28->next) {
      current_child = (cJSON *)((long)&current_child[-1].string + 7);
    }
    array_local = local_28;
  }
  return array_local;
}

Assistant:

static cJSON* get_array_item(const cJSON *array, size_t index)
{
    cJSON *current_child = NULL;

    if (array == NULL)
    {
        return NULL;
    }

    current_child = array->child;
    while ((current_child != NULL) && (index > 0))
    {
        index--;
        current_child = current_child->next;
    }

    return current_child;
}